

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O2

void __thiscall
spdlog::details::short_level_formatter::format
          (short_level_formatter *this,log_msg *msg,tm *param_2,memory_buffer *dest)

{
  char *__s;
  fmt_helper *this_00;
  memory_buffer *dest_00;
  string_view_t view;
  scoped_pad p;
  scoped_pad sStack_48;
  
  __s = *(char **)(level::short_level_names + (ulong)msg->level * 8);
  this_00 = (fmt_helper *)strlen(__s);
  dest_00 = dest;
  scoped_pad::scoped_pad(&sStack_48,(size_t)this_00,&(this->super_flag_formatter).padinfo_,dest);
  view._M_str = (char *)dest;
  view._M_len = (size_t)__s;
  fmt_helper::append_string_view<500ul>(this_00,view,dest_00);
  scoped_pad::~scoped_pad(&sStack_48);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, fmt::memory_buffer &dest) override
    {
        string_view_t level_name{level::to_short_c_str(msg.level)};
        scoped_pad p(level_name, padinfo_, dest);
        fmt_helper::append_string_view(level_name, dest);
    }